

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

void predict(log_multi *b,single_learner *base,example *ec)

{
  uint32_t uVar1;
  label_t lVar2;
  node *pnVar3;
  uint64_t uVar4;
  node *pnVar5;
  ulong uVar6;
  
  lVar2 = (ec->l).multi;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar5 = (b->nodes)._begin;
  if (pnVar5->internal == true) {
    uVar4 = (ec->super_example_predict).ft_offset;
    uVar6 = 0;
    do {
      uVar1 = pnVar5->base_predictor;
      (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar1 + uVar4;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar4 = (ec->super_example_predict).ft_offset - (ulong)(uVar1 * *(int *)(base + 0xe0));
      (ec->super_example_predict).ft_offset = uVar4;
      pnVar3 = (b->nodes)._begin;
      uVar6 = (ulong)(&pnVar3[uVar6].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      pnVar5 = pnVar3 + uVar6;
    } while (pnVar3[uVar6].internal != false);
  }
  (ec->pred).scalar = (float)pnVar5->max_count_label;
  (ec->l).multi = lVar2;
  return;
}

Assistant:

void predict(log_multi& b, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  uint32_t cn = 0;
  uint32_t depth = 0;
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_predictor);  // depth
    cn = descend(b.nodes[cn], ec.pred.scalar);
    depth++;
  }
  ec.pred.multiclass = b.nodes[cn].max_count_label;
  ec.l.multi = mc;
}